

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope.cxx
# Opt level: O0

void __thiscall xray_re::xr_envelope::load_1(xr_envelope *this,xr_reader *r)

{
  f_r_new<xray_re::xr_key> read;
  uint32_t uVar1;
  xr_key_vec *container;
  xr_reader *this_00;
  f_r_new<xray_re::xr_key> local_28;
  xr_reader *local_18;
  xr_reader *r_local;
  xr_envelope *this_local;
  
  local_18 = r;
  r_local = (xr_reader *)this;
  uVar1 = xr_reader::r_u32(r);
  this->m_behaviour0 = (uint8_t)uVar1;
  uVar1 = xr_reader::r_u32(local_18);
  this->m_behaviour1 = (uint8_t)uVar1;
  this_00 = local_18;
  uVar1 = xr_reader::r_u32(local_18);
  container = &this->m_keys;
  xr_reader::f_r_new<xray_re::xr_key>::f_r_new(&local_28,0x1b7450);
  read._8_8_ = this_00;
  read.pmf = (offset_in_xr_key_to_subr)this;
  xr_reader::
  r_seq<std::vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>>,xray_re::xr_reader::f_r_new<xray_re::xr_key>>
            (this_00,(ulong)uVar1,container,read);
  return;
}

Assistant:

void xr_envelope::load_1(xr_reader& r)
{
	m_behaviour0 = uint8_t(r.r_u32() & UINT8_MAX);
	m_behaviour1 = uint8_t(r.r_u32() & UINT8_MAX);
	r.r_seq(r.r_u32(), m_keys, xr_reader::f_r_new<xr_key>(&xr_key::load_1));
}